

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  undefined1 uVar5;
  code cVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  int iVar10;
  uint uVar11;
  char *__s;
  long lVar12;
  int iVar13;
  char **ppcVar14;
  string *input_stream;
  bool bVar15;
  uint8_t data;
  int num_column;
  int start_index;
  string residual_characters;
  string space;
  ostringstream stored_characters;
  ifstream ifs;
  byte local_401;
  int local_400;
  int local_3fc;
  string local_3f8;
  char **local_3d8;
  char *local_3d0;
  long local_3c8;
  char local_3c0 [16];
  undefined1 local_3b0 [16];
  char local_3a0 [96];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_3fc = 0;
  local_400 = 0x10;
  ppcVar14 = (char **)0x0;
  iVar13 = 0;
  local_3d8 = argv;
  do {
    iVar7 = ya_getopt_long(argc,local_3d8,"s:c:o:h",(option *)0x0,(int *)0x0);
    if (iVar7 < 0x68) {
      iVar10 = 2;
      if (iVar7 != -1) {
        if (iVar7 != 99) {
LAB_001038d4:
          anon_unknown.dwarf_1ff9::PrintUsage((ostream *)&std::cerr);
          goto LAB_00103a01;
        }
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar15 = sptk::ConvertStringToInteger(&local_238,&local_400);
        bVar3 = local_400 < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (!bVar15 || bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,
                     "The argument for the -c option must be a positive integer",0x39);
          local_3b0._0_8_ = local_3a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"fd","");
          sptk::PrintErrorMessage((string *)local_3b0,(ostringstream *)&local_238);
          goto LAB_001039d6;
        }
LAB_0010384a:
        iVar10 = 0;
      }
    }
    else if (iVar7 == 0x68) {
      anon_unknown.dwarf_1ff9::PrintUsage((ostream *)&std::cout);
      iVar13 = 0;
      iVar10 = 1;
    }
    else {
      if (iVar7 == 0x6f) {
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar3 = sptk::ConvertStringToInteger(&local_238,(int *)&local_3f8);
        if (bVar3) {
          bVar3 = sptk::IsInRange((int)local_3f8._M_dataplus._M_p,0,3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          if (bVar3) {
            iVar10 = 0;
            ppcVar14 = (char **)((ulong)local_3f8._M_dataplus._M_p & 0xffffffff);
            goto LAB_00103a0b;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"in the range of ",0x10);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
        std::ostream::operator<<((ostream *)poVar9,3);
        local_3b0._0_8_ = local_3a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"fd","");
        sptk::PrintErrorMessage((string *)local_3b0,(ostringstream *)&local_238);
      }
      else {
        if (iVar7 != 0x73) goto LAB_001038d4;
        std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
        bVar3 = sptk::ConvertStringToInteger(&local_238,&local_3fc);
        bVar15 = -1 < local_3fc;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3 && bVar15) goto LAB_0010384a;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -s option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0._0_8_ = local_3a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"fd","");
        sptk::PrintErrorMessage((string *)local_3b0,(ostringstream *)&local_238);
      }
LAB_001039d6:
      if ((char *)local_3b0._0_8_ != local_3a0) {
        operator_delete((void *)local_3b0._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
LAB_00103a01:
      iVar10 = 1;
      iVar13 = 1;
    }
LAB_00103a0b:
  } while (iVar10 == 0);
  if (iVar10 != 2) {
    return iVar13;
  }
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      __s = (char *)0x0;
    }
    else {
      __s = local_3d8[ya_optind];
    }
    bVar3 = sptk::SetBinaryMode();
    if (bVar3) {
      input_stream = &local_238;
      std::ifstream::ifstream(input_stream);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 == '\0') {
          input_stream = (string *)&std::cin;
        }
        local_3d8 = ppcVar14;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        paVar1 = &local_3f8.field_2;
        iVar13 = local_3fc;
        while (bVar3 = sptk::ReadStream<unsigned_char>(&local_401,(istream *)input_stream), bVar3) {
          if ((iVar13 - local_3fc) % local_400 == 0) {
            iVar7 = (int)local_3d8;
            if (iVar7 == 3) {
              lVar12 = (long)&std::cout + *(long *)(std::cout + -0x18);
              uVar11 = 0x40;
              if ((&DAT_00111251)[*(long *)(std::cout + -0x18)] == '\0') {
                uVar5 = std::ios::widen((char)lVar12);
                uVar11 = 0x40;
LAB_00103d2e:
                *(undefined1 *)(lVar12 + 0xe0) = uVar5;
                *(undefined1 *)(lVar12 + 0xe1) = 1;
              }
            }
            else if (iVar7 == 2) {
              lVar12 = (long)&std::cout + *(long *)(std::cout + -0x18);
              uVar11 = 2;
              if ((&DAT_00111251)[*(long *)(std::cout + -0x18)] == '\0') {
                uVar5 = std::ios::widen((char)lVar12);
                uVar11 = 2;
                goto LAB_00103d2e;
              }
            }
            else {
              if (iVar7 != 1) goto LAB_00103d85;
              lVar12 = (long)&std::cout + *(long *)(std::cout + -0x18);
              uVar11 = 8;
              if ((&DAT_00111251)[*(long *)(std::cout + -0x18)] == '\0') {
                uVar5 = std::ios::widen((char)lVar12);
                uVar11 = 8;
                goto LAB_00103d2e;
              }
            }
            *(undefined1 *)(lVar12 + 0xe0) = 0x30;
            lVar12 = std::cout;
            *(undefined8 *)(vfprintf + *(long *)(std::cout + -0x18)) = 6;
            *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(lVar12 + -0x18)) =
                 *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(lVar12 + -0x18)) &
                 0xffffffb5 | uVar11;
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
          }
LAB_00103d85:
          bVar2 = local_401;
          iVar7 = isprint((uint)local_401);
          if (iVar7 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,".",1);
          }
          else {
            local_3f8._M_dataplus._M_p._0_1_ = bVar2;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,(char *)&local_3f8,1);
          }
          lVar12 = *(long *)(std::cout + -0x18);
          if ((&DAT_00111251)[lVar12] == '\0') {
            cVar6 = (code)std::ios::widen((char)lVar12 + 'p');
            std::__cxx11::string::_M_create[lVar12] = cVar6;
            (&DAT_00111251)[lVar12] = 1;
          }
          std::__cxx11::string::_M_create[lVar12] = (code)0x30;
          lVar12 = std::cout;
          *(undefined8 *)(vfprintf + *(long *)(std::cout + -0x18)) = 2;
          *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(lVar12 + -0x18)) =
               *(uint *)(std::__cxx11::ostringstream::ostringstream + *(long *)(lVar12 + -0x18)) &
               0xffffffb5 | 8;
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)local_401);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          if (local_400 + -1 == (iVar13 - local_3fc) % local_400) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
            std::__cxx11::stringbuf::str();
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_3f8._M_dataplus._M_p,
                                local_3f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"|\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3f8._M_dataplus._M_p);
            }
            local_3f8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
            std::__cxx11::stringbuf::str((string *)(local_3b0 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3f8._M_dataplus._M_p);
            }
          }
          iVar13 = iVar13 + 1;
        }
        std::__cxx11::stringbuf::str();
        if (local_3f8._M_string_length != 0) {
          local_3d0 = local_3c0;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_3d0,((char)local_400 - (char)local_3f8._M_string_length) * '\x03'
                    );
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_3d0,local_3c8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"|",1);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"|",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (local_3d0 != local_3c0) {
            operator_delete(local_3d0);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        iVar13 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Cannot open file ",0x11);
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar8);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"fd","");
        sptk::PrintErrorMessage(&local_3f8,(ostringstream *)local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        iVar13 = 1;
      }
      std::ifstream::~ifstream(&local_238);
      return iVar13;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Cannot set translation mode",0x1b);
    local_3b0._0_8_ = local_3a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"fd","");
    sptk::PrintErrorMessage((string *)local_3b0,(ostringstream *)&local_238);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0._0_8_ = local_3a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"fd","");
    sptk::PrintErrorMessage((string *)local_3b0,(ostringstream *)&local_238);
  }
  if ((char *)local_3b0._0_8_ != local_3a0) {
    operator_delete((void *)local_3b0._0_8_);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_index(kDefaultStartIndex);
  int num_column(kDefaultNumColumn);
  AddressFormats address_format(kDefaultAddressFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:c:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_index) ||
            start_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumAddressFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("fd", error_message);
          return 1;
        }
        address_format = static_cast<AddressFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("fd", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("fd", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("fd", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  std::uint8_t data;
  std::ostringstream stored_characters;

  for (int index(start_index); sptk::ReadStream(&data, &input_stream);
       ++index) {
    // Output address.
    if (0 == (index - start_index) % num_column) {
      switch (address_format) {
        case kNone: {
          // nothing to do
          break;
        }
        case kHexadecimal: {
          std::cout << std::setfill('0') << std::setw(6) << std::hex << index
                    << "  ";
          break;
        }
        case kDecimal: {
          std::cout << std::setfill('0') << std::setw(6) << std::dec << index
                    << "  ";
          break;
        }
        case kOctal: {
          std::cout << std::setfill('0') << std::setw(6) << std::oct << index
                    << "  ";
          break;
        }
        default: {
          break;
        }
      }
    }

    // Stack human-readable characters.
    if (std::isprint(data)) {
      stored_characters << data;
    } else {
      stored_characters << ".";
    }

    // Output data.
    std::cout << std::setfill('0') << std::setw(2) << std::hex
              << static_cast<int>(data) << " ";

    // Output new line.
    if (num_column - 1 == (index - start_index) % num_column) {
      std::cout << "|" << stored_characters.str() << "|\n";
      stored_characters.str("");  // Clear.
    }
  }

  // Flush.
  const std::string residual_characters(stored_characters.str());
  if (!residual_characters.empty()) {
    const std::string space(3 * (num_column - residual_characters.size()), ' ');
    std::cout << space << "|" << residual_characters << "|" << std::endl;
  }

  return 0;
}